

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRefining.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_208::GlobalRefining::~GlobalRefining(GlobalRefining *this)

{
  GlobalRefining *this_local;
  
  ~GlobalRefining(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

bool requiresNonNullableLocalFixups() override { return false; }